

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O3

LengthPercentage
Rml::ComputeOrigin(Property *property,float font_size,float document_font_size,float dp_ratio,
                  Vector2f vp_dimensions)

{
  NumericValue value;
  ulong uVar1;
  undefined4 in_XMM3_Dc;
  undefined4 in_XMM3_Dd;
  int local_20;
  float local_1c;
  undefined1 local_18 [16];
  
  if (property->unit == PERCENT) {
    local_1c = 0.0;
    Variant::GetInto<float,_0>(&property->value,&local_1c);
  }
  else {
    if (property->unit != KEYWORD) {
      local_18._8_4_ = in_XMM3_Dc;
      local_18._0_8_ = vp_dimensions;
      local_18._12_4_ = in_XMM3_Dd;
      value = Property::GetNumericValue(property);
      local_1c = ComputeLength(value,font_size,document_font_size,dp_ratio,(Vector2f)local_18._0_8_)
      ;
      uVar1 = 0;
      goto LAB_001e5848;
    }
    local_20 = 0;
    Variant::GetInto<int,_0>(&property->value,&local_20);
    if ((char)local_20 == '\x01') {
      local_1c = 50.0;
    }
    else {
      local_1c = 0.0;
    }
    if ((char)local_20 == '\x02') {
      local_1c = 100.0;
    }
  }
  uVar1 = 1;
LAB_001e5848:
  return (LengthPercentage)((ulong)(uint)local_1c << 0x20 | uVar1);
}

Assistant:

Style::LengthPercentage ComputeOrigin(const Property* property, float font_size, float document_font_size, float dp_ratio, Vector2f vp_dimensions)
{
	using namespace Style;
	static_assert(
		(int)OriginX::Left == (int)OriginY::Top && (int)OriginX::Center == (int)OriginY::Center && (int)OriginX::Right == (int)OriginY::Bottom, "");

	if (property->unit == Unit::KEYWORD)
	{
		float percent = 0.0f;
		OriginX origin = (OriginX)property->Get<int>();
		switch (origin)
		{
		case OriginX::Left: percent = 0.0f; break;
		case OriginX::Center: percent = 50.0f; break;
		case OriginX::Right: percent = 100.f; break;
		}
		return LengthPercentage(LengthPercentage::Percentage, percent);
	}
	else if (property->unit == Unit::PERCENT)
		return LengthPercentage(LengthPercentage::Percentage, property->Get<float>());

	return LengthPercentage(LengthPercentage::Length,
		ComputeLength(property->GetNumericValue(), font_size, document_font_size, dp_ratio, vp_dimensions));
}